

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

double asl::myatof(char *s)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  bool bVar4;
  __type _Var5;
  long lStack_38;
  int c;
  longlong y1;
  char *p;
  double dStack_20;
  int exp;
  double m;
  double y;
  char *s_local;
  
  dStack_20 = 1.0;
  p._4_4_ = 0;
  y = (double)s;
  if (*s == '-') {
    dStack_20 = -1.0;
    y = (double)(s + 1);
  }
  pcVar2 = strchr((char *)y,0x2e);
  if (pcVar2 != (char *)0x0) {
    while( true ) {
      y1 = (long)pcVar2 + 1;
      bVar4 = false;
      if ((*(char *)y1 != '\0') && (bVar4 = false, *(char *)y1 != 'e')) {
        bVar4 = *(char *)y1 != 'E';
      }
      if (!bVar4) break;
      p._4_4_ = p._4_4_ + -1;
      pcVar2 = (char *)y1;
    }
  }
  y1 = (longlong)pcVar2;
  pcVar2 = (char *)y1;
  if (y1 == 0) {
    y1 = (longlong)y;
    pcVar2 = (char *)y1;
  }
  do {
    y1 = (longlong)pcVar2;
    pcVar2 = (char *)(y1 + 1);
    if (*(char *)y1 == '\0') goto LAB_00133afd;
  } while ((*pcVar2 != 'e') && (*pcVar2 != 'E'));
  if (*(char *)(y1 + 2) == '+') {
    pcVar2 = (char *)(y1 + 2);
  }
  y1 = (longlong)pcVar2;
  iVar1 = myatoiz((char *)(y1 + 1));
  p._4_4_ = iVar1 + p._4_4_;
LAB_00133afd:
  lStack_38 = 0;
  while( true ) {
    dVar3 = (double)((long)y + 1);
    iVar1 = (int)*(char *)y;
    if (iVar1 == 0) break;
    y = dVar3;
    if (iVar1 != 0x2e) {
      if ((iVar1 == 0x45) || (iVar1 == 0x65)) break;
      lStack_38 = lStack_38 * 10 + (long)(iVar1 + -0x30);
    }
  }
  _Var5 = std::pow<double,int>(10.0,p._4_4_);
  return (double)lStack_38 * _Var5 * dStack_20;
}

Assistant:

double myatof(const char* s)
{
	double y = 0;
	double m = 1;
	int exp = 0;
	if (s[0] == '-') { m = -1; s++; }
	const char* p = strchr(s, '.');
	if (p) {
		p++;
		while (*p != '\0' && *p != 'e' && *p != 'E') {
			exp--;
			p++;
		}
		p--;
	}
	if (!p) p = s;
	while (*p++)
		if (*p == 'e' || *p == 'E'){
			if (*(p + 1) == '+')
				p++;
			exp += myatoiz(p + 1);
			break;
		}
	long long y1 = 0;
	while (int c = *s++)
	{
		if (c == '.') continue;
		if (c == 'E' || c == 'e') break;
		y1 = 10 * y1 + (c - '0');
	}
	y = double(y1) * pow(10.0, exp);
	return y * m;
}